

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O1

void __thiscall
pbrt::ImageInfiniteLight::ImageInfiniteLight
          (ImageInfiniteLight *this,Transform renderFromLight,Image *im,
          RGBColorSpace *imageColorSpace,Float scale,string *filename,Allocator alloc)

{
  float *pfVar1;
  Tuple2<pbrt::Point2,_int> TVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined8 uVar16;
  byte bVar17;
  byte bVar18;
  size_t sVar19;
  ulong uVar20;
  int iVar21;
  memory_resource *pmVar22;
  long lVar23;
  ulong uVar24;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *pvVar25;
  long in_FS_OFFSET;
  ushort uVar26;
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  double dVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  span<const_float> func;
  span<const_float> func_00;
  Array2D<float> d;
  size_t vb;
  Tuple2<pbrt::Point2,_float> TStack_d8;
  undefined1 local_d0 [16];
  undefined1 *local_c0;
  undefined1 local_b0 [16];
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *local_a0 [2];
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_90;
  Float local_70;
  Float FStack_6c;
  Float local_68;
  ImageChannelDesc channelDesc;
  
  (this->super_LightBase).type = Infinite;
  auVar27 = vmovdqu64_avx512f((undefined1  [64])renderFromLight.m.m);
  auVar27 = vmovdqu64_avx512f(auVar27);
  *(undefined1 (*) [64])(this->super_LightBase).renderFromLight.m.m = auVar27;
  *(undefined8 *)(this->super_LightBase).renderFromLight.mInv.m[0] = renderFromLight.mInv.m[0]._0_8_
  ;
  *(undefined8 *)((this->super_LightBase).renderFromLight.mInv.m[0] + 2) =
       renderFromLight.mInv.m[0]._8_8_;
  *(undefined8 *)(this->super_LightBase).renderFromLight.mInv.m[1] = renderFromLight.mInv.m[1]._0_8_
  ;
  *(undefined8 *)((this->super_LightBase).renderFromLight.mInv.m[1] + 2) =
       renderFromLight.mInv.m[1]._8_8_;
  *(undefined8 *)(this->super_LightBase).renderFromLight.mInv.m[2] = renderFromLight.mInv.m[2]._0_8_
  ;
  *(undefined8 *)((this->super_LightBase).renderFromLight.mInv.m[2] + 2) =
       renderFromLight.mInv.m[2]._8_8_;
  *(undefined8 *)(this->super_LightBase).renderFromLight.mInv.m[3] = renderFromLight.mInv.m[3]._0_8_
  ;
  *(undefined8 *)((this->super_LightBase).renderFromLight.mInv.m[3] + 2) =
       renderFromLight.mInv.m[3]._8_8_;
  (this->super_LightBase).mediumInterface.inside =
       (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
        )0x0;
  (this->super_LightBase).mediumInterface.outside =
       (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
        )0x0;
  *(long *)(in_FS_OFFSET + -0x368) = *(long *)(in_FS_OFFSET + -0x368) + 1;
  (this->image).resolution.super_Tuple2<pbrt::Point2,_int>.y =
       (im->resolution).super_Tuple2<pbrt::Point2,_int>.y;
  iVar21 = (im->resolution).super_Tuple2<pbrt::Point2,_int>.x;
  (this->image).format = im->format;
  (this->image).resolution.super_Tuple2<pbrt::Point2,_int>.x = iVar21;
  (this->image).channelNames.alloc.memoryResource = (im->channelNames).alloc.memoryResource;
  (this->image).channelNames.nStored = 0;
  (this->image).channelNames.ptr =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  (this->image).channelNames.nAlloc = 0;
  sVar19 = (im->channelNames).nStored;
  (this->image).channelNames.nAlloc = (im->channelNames).nAlloc;
  (this->image).channelNames.nStored = sVar19;
  (this->image).channelNames.ptr = (im->channelNames).ptr;
  (im->channelNames).nStored = 0;
  (im->channelNames).ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  (im->channelNames).nAlloc = 0;
  (this->image).encoding.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = 0;
  pmVar22 = (im->p8).alloc.memoryResource;
  (this->image).encoding.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = (im->encoding).
         super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
         .bits;
  (this->image).p8.alloc.memoryResource = pmVar22;
  (this->image).p8.ptr = (uchar *)0x0;
  (this->image).p8.nAlloc = 0;
  (this->image).p8.nStored = 0;
  sVar19 = (im->p8).nStored;
  (this->image).p8.nAlloc = (im->p8).nAlloc;
  (this->image).p8.nStored = sVar19;
  (this->image).p8.ptr = (im->p8).ptr;
  (im->p8).nStored = 0;
  (im->p8).ptr = (uchar *)0x0;
  (im->p8).nAlloc = 0;
  (this->image).p16.alloc.memoryResource = (im->p16).alloc.memoryResource;
  (this->image).p16.nStored = 0;
  (this->image).p16.ptr = (Half *)0x0;
  (this->image).p16.nAlloc = 0;
  sVar19 = (im->p16).nStored;
  (this->image).p16.nAlloc = (im->p16).nAlloc;
  (this->image).p16.nStored = sVar19;
  (this->image).p16.ptr = (im->p16).ptr;
  (im->p16).nStored = 0;
  (im->p16).ptr = (Half *)0x0;
  (im->p16).nAlloc = 0;
  (this->image).p32.alloc.memoryResource = (im->p32).alloc.memoryResource;
  (this->image).p32.nStored = 0;
  (this->image).p32.ptr = (float *)0x0;
  (this->image).p32.nAlloc = 0;
  sVar19 = (im->p32).nStored;
  (this->image).p32.nAlloc = (im->p32).nAlloc;
  (this->image).p32.nStored = sVar19;
  (this->image).p32.ptr = (im->p32).ptr;
  (im->p32).nStored = 0;
  (im->p32).ptr = (float *)0x0;
  (im->p32).nAlloc = 0;
  this->imageColorSpace = imageColorSpace;
  this->scale = scale;
  (this->sceneCenter).super_Tuple3<pbrt::Point3,_float>.x = 0.0;
  (this->sceneCenter).super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  (this->sceneCenter).super_Tuple3<pbrt::Point3,_float>.z = 0.0;
  (this->distribution).domain.pMin.super_Tuple2<pbrt::Point2,_float> =
       (Tuple2<pbrt::Point2,_float>)0x7f7fffff7f7fffff;
  (this->distribution).domain.pMax.super_Tuple2<pbrt::Point2,_float> =
       (Tuple2<pbrt::Point2,_float>)0xff7fffffff7fffff;
  (this->distribution).pConditionalV.alloc.memoryResource = alloc.memoryResource;
  (this->distribution).pConditionalV.ptr = (PiecewiseConstant1D *)0x0;
  (this->distribution).pConditionalV.nAlloc = 0;
  (this->distribution).pConditionalV.nStored = 0;
  (this->distribution).pMarginal.func.alloc.memoryResource = alloc.memoryResource;
  (this->distribution).pMarginal.func.ptr = (float *)0x0;
  (this->distribution).pMarginal.func.nAlloc = 0;
  (this->distribution).pMarginal.func.nStored = 0;
  (this->distribution).pMarginal.cdf.alloc.memoryResource = alloc.memoryResource;
  (this->distribution).pMarginal.cdf.ptr = (float *)0x0;
  (this->distribution).pMarginal.cdf.nAlloc = 0;
  (this->distribution).pMarginal.cdf.nStored = 0;
  (this->distribution).pMarginal.funcInt = 0.0;
  (this->compensatedDistribution).domain.pMin.super_Tuple2<pbrt::Point2,_float> =
       (Tuple2<pbrt::Point2,_float>)0x7f7fffff7f7fffff;
  (this->compensatedDistribution).domain.pMax.super_Tuple2<pbrt::Point2,_float> =
       (Tuple2<pbrt::Point2,_float>)0xff7fffffff7fffff;
  (this->compensatedDistribution).pConditionalV.alloc.memoryResource = alloc.memoryResource;
  (this->compensatedDistribution).pConditionalV.nStored = 0;
  (this->compensatedDistribution).pConditionalV.ptr = (PiecewiseConstant1D *)0x0;
  (this->compensatedDistribution).pConditionalV.nAlloc = 0;
  (this->compensatedDistribution).pMarginal.func.alloc.memoryResource = alloc.memoryResource;
  (this->compensatedDistribution).pMarginal.func.ptr = (float *)0x0;
  (this->compensatedDistribution).pMarginal.func.nAlloc = 0;
  (this->compensatedDistribution).pMarginal.func.nStored = 0;
  (this->compensatedDistribution).pMarginal.cdf.alloc.memoryResource = alloc.memoryResource;
  (this->compensatedDistribution).pMarginal.cdf.ptr = (float *)0x0;
  (this->compensatedDistribution).pMarginal.cdf.nAlloc = 0;
  (this->compensatedDistribution).pMarginal.cdf.nStored = 0;
  (this->compensatedDistribution).pMarginal.funcInt = 0.0;
  TStack_d8 = (Tuple2<pbrt::Point2,_float>)vb;
  vb = (size_t)local_d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&vb,"R","");
  local_c0 = local_b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"G","");
  pvVar25 = &local_90;
  local_a0[0] = pvVar25;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"B","");
  requestedChannels.n = 3;
  requestedChannels.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vb;
  Image::GetChannelDesc(&channelDesc,&this->image,requestedChannels);
  lVar23 = -0x60;
  do {
    if (pvVar25 != (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)pvVar25[-1].nAlloc) {
      operator_delete((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)pvVar25[-1].nAlloc,
                      (ulong)((long)&((pvVar25->alloc).memoryResource)->_vptr_memory_resource + 1));
    }
    pvVar25 = pvVar25 + -1;
    lVar23 = lVar23 + 0x20;
  } while (lVar23 != 0);
  if (channelDesc.offset.nStored == 0) {
    ErrorExit<std::__cxx11::string&>
              ("%s: image used for ImageInfiniteLight doesn\'t have R, G, B channels.",filename);
  }
  d.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x = 3;
  vb = channelDesc.offset.nStored;
  if (channelDesc.offset.nStored != 3) {
    LogFatal<char_const(&)[2],char_const(&)[19],char_const(&)[2],int&,char_const(&)[19],unsigned_long&>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/lights.cpp"
               ,0x3ac,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [2])0x458bf1,
               (char (*) [19])"channelDesc.size()",(char (*) [2])0x458bf1,(int *)&d,
               (char (*) [19])"channelDesc.size()",&vb);
  }
  if (channelDesc.offset.ptr == (int *)0x0) {
    channelDesc.offset.ptr = (int *)&channelDesc.offset.field_2;
  }
  if (*channelDesc.offset.ptr == 0) {
    uVar20 = 1;
    do {
      uVar24 = uVar20;
      if (uVar24 == 3) break;
      uVar20 = uVar24 + 1;
    } while (uVar24 == (long)channelDesc.offset.ptr[uVar24]);
    if (2 < uVar24) {
      TVar2 = (this->image).resolution.super_Tuple2<pbrt::Point2,_int>;
      if (TVar2.x != TVar2.y) {
        vb._0_4_ = TVar2.x;
        vb._4_4_ = TVar2.y;
        d.extent.pMin.super_Tuple2<pbrt::Point2,_int> = TVar2;
        ErrorExit<std::__cxx11::string&,int,int>
                  ("%s: image resolution (%d, %d) is non-square. It\'s unlikely this is an equal area environment map."
                   ,filename,(int *)&vb,&d.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y);
      }
      auVar37._8_4_ = 0x3f800000;
      auVar37._0_8_ = 0x3f8000003f800000;
      auVar37._12_4_ = 0x3f800000;
      _vb = (Bounds2f)vpunpcklqdq_avx((undefined1  [16])0x0,auVar37);
      pmVar22 = pstd::pmr::new_delete_resource();
      Image::
      GetSamplingDistribution<pbrt::Image::GetSamplingDistribution()::_lambda(pbrt::Point2<float>)_1_>
                (&d,&this->image,&vb,pmVar22);
      auVar35._8_8_ = 0;
      auVar35._0_4_ = d.extent.pMax.super_Tuple2<pbrt::Point2,_int>.x;
      auVar35._4_4_ = d.extent.pMax.super_Tuple2<pbrt::Point2,_int>.y;
      auVar38._8_8_ = 0;
      auVar38._0_4_ = d.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x;
      auVar38._4_4_ = d.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y;
      auVar35 = vpsubd_avx(auVar35,auVar38);
      func.n = (size_t)(auVar35._4_4_ * auVar35._0_4_);
      func.ptr = d.values;
      PiecewiseConstant2D::PiecewiseConstant2D
                ((PiecewiseConstant2D *)&vb,func,auVar35._0_4_,auVar35._4_4_,
                 (Bounds2f)(ZEXT816(0x3f8000003f800000) << 0x40),alloc);
      (this->distribution).domain.pMin.super_Tuple2<pbrt::Point2,_float> =
           (Tuple2<pbrt::Point2,_float>)vb;
      (this->distribution).domain.pMax.super_Tuple2<pbrt::Point2,_float> = TStack_d8;
      pstd::
      vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>
      ::operator=(&(this->distribution).pConditionalV,
                  (vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>
                   *)local_d0);
      pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
                (&(this->distribution).pMarginal.func,
                 (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)local_b0);
      pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
                (&(this->distribution).pMarginal.cdf,&local_90);
      (this->distribution).pMarginal.funcInt = local_68;
      (this->distribution).pMarginal.min = local_70;
      (this->distribution).pMarginal.max = FStack_6c;
      pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&local_90);
      pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
                ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)local_b0);
      pstd::
      vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>
      ::~vector((vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>
                 *)local_d0);
      auVar36._8_8_ = 0;
      auVar36._0_4_ = d.extent.pMax.super_Tuple2<pbrt::Point2,_int>.x;
      auVar36._4_4_ = d.extent.pMax.super_Tuple2<pbrt::Point2,_int>.y;
      auVar39._8_8_ = 0;
      auVar39._0_4_ = d.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x;
      auVar39._4_4_ = d.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y;
      auVar35 = vpsubd_avx(auVar36,auVar39);
      iVar21 = auVar35._4_4_ * auVar35._0_4_;
      func_00.n = (size_t)iVar21;
      if (iVar21 == 0) {
        dVar34 = 0.0;
      }
      else {
        dVar34 = 0.0;
        lVar23 = 0;
        do {
          dVar34 = dVar34 + (double)*(float *)((long)d.values + lVar23);
          lVar23 = lVar23 + 4;
        } while (func_00.n * 4 - lVar23 != 0);
      }
      if (iVar21 != 0) {
        auVar40._0_4_ = (float)(dVar34 / (double)iVar21);
        auVar40._4_4_ = (int)((ulong)(dVar34 / (double)iVar21) >> 0x20);
        auVar40._8_8_ = 0;
        auVar27 = vpbroadcastq_avx512f();
        auVar28 = vbroadcastss_avx512f(auVar40);
        auVar29 = vbroadcastss_avx512f(ZEXT416((uint)(auVar40._0_4_ * 0.001)));
        lVar23 = 0;
        auVar30 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar31 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        do {
          auVar32 = vpbroadcastq_avx512f();
          auVar33 = vporq_avx512f(auVar32,auVar30);
          auVar32 = vporq_avx512f(auVar32,auVar31);
          uVar16 = vpcmpuq_avx512f(auVar32,auVar27,2);
          bVar17 = (byte)uVar16;
          uVar16 = vpcmpuq_avx512f(auVar33,auVar27,2);
          bVar18 = (byte)uVar16;
          uVar26 = CONCAT11(bVar18,bVar17);
          pfVar1 = d.values + lVar23;
          auVar32._4_4_ = (uint)((byte)(uVar26 >> 1) & 1) * (int)pfVar1[1];
          auVar32._0_4_ = (uint)(bVar17 & 1) * (int)*pfVar1;
          auVar32._8_4_ = (uint)((byte)(uVar26 >> 2) & 1) * (int)pfVar1[2];
          auVar32._12_4_ = (uint)((byte)(uVar26 >> 3) & 1) * (int)pfVar1[3];
          auVar32._16_4_ = (uint)((byte)(uVar26 >> 4) & 1) * (int)pfVar1[4];
          auVar32._20_4_ = (uint)((byte)(uVar26 >> 5) & 1) * (int)pfVar1[5];
          auVar32._24_4_ = (uint)((byte)(uVar26 >> 6) & 1) * (int)pfVar1[6];
          auVar32._28_4_ = (uint)((byte)(uVar26 >> 7) & 1) * (int)pfVar1[7];
          auVar32._32_4_ = (uint)(bVar18 & 1) * (int)pfVar1[8];
          auVar32._36_4_ = (uint)(bVar18 >> 1 & 1) * (int)pfVar1[9];
          auVar32._40_4_ = (uint)(bVar18 >> 2 & 1) * (int)pfVar1[10];
          auVar32._44_4_ = (uint)(bVar18 >> 3 & 1) * (int)pfVar1[0xb];
          auVar32._48_4_ = (uint)(bVar18 >> 4 & 1) * (int)pfVar1[0xc];
          auVar32._52_4_ = (uint)(bVar18 >> 5 & 1) * (int)pfVar1[0xd];
          auVar32._56_4_ = (uint)(bVar18 >> 6 & 1) * (int)pfVar1[0xe];
          auVar32._60_4_ = (uint)(bVar18 >> 7) * (int)pfVar1[0xf];
          auVar33 = vsubps_avx512f(auVar32,auVar28);
          auVar32 = vminps_avx512f(auVar32,auVar29);
          auVar32 = vmaxps_avx512f(auVar32,auVar33);
          pfVar1 = d.values + lVar23;
          bVar3 = (bool)((byte)(uVar26 >> 1) & 1);
          bVar4 = (bool)((byte)(uVar26 >> 2) & 1);
          bVar5 = (bool)((byte)(uVar26 >> 3) & 1);
          bVar6 = (bool)((byte)(uVar26 >> 4) & 1);
          bVar7 = (bool)((byte)(uVar26 >> 5) & 1);
          bVar8 = (bool)((byte)(uVar26 >> 6) & 1);
          bVar9 = (bool)((byte)(uVar26 >> 7) & 1);
          bVar10 = (bool)(bVar18 >> 1 & 1);
          bVar11 = (bool)(bVar18 >> 2 & 1);
          bVar12 = (bool)(bVar18 >> 3 & 1);
          bVar13 = (bool)(bVar18 >> 4 & 1);
          bVar14 = (bool)(bVar18 >> 5 & 1);
          bVar15 = (bool)(bVar18 >> 6 & 1);
          *pfVar1 = (float)((uint)(bVar17 & 1) * auVar32._0_4_ |
                           (uint)!(bool)(bVar17 & 1) * (int)*pfVar1);
          pfVar1[1] = (float)((uint)bVar3 * auVar32._4_4_ | (uint)!bVar3 * (int)pfVar1[1]);
          pfVar1[2] = (float)((uint)bVar4 * auVar32._8_4_ | (uint)!bVar4 * (int)pfVar1[2]);
          pfVar1[3] = (float)((uint)bVar5 * auVar32._12_4_ | (uint)!bVar5 * (int)pfVar1[3]);
          pfVar1[4] = (float)((uint)bVar6 * auVar32._16_4_ | (uint)!bVar6 * (int)pfVar1[4]);
          pfVar1[5] = (float)((uint)bVar7 * auVar32._20_4_ | (uint)!bVar7 * (int)pfVar1[5]);
          pfVar1[6] = (float)((uint)bVar8 * auVar32._24_4_ | (uint)!bVar8 * (int)pfVar1[6]);
          pfVar1[7] = (float)((uint)bVar9 * auVar32._28_4_ | (uint)!bVar9 * (int)pfVar1[7]);
          pfVar1[8] = (float)((uint)(bVar18 & 1) * auVar32._32_4_ |
                             (uint)!(bool)(bVar18 & 1) * (int)pfVar1[8]);
          pfVar1[9] = (float)((uint)bVar10 * auVar32._36_4_ | (uint)!bVar10 * (int)pfVar1[9]);
          pfVar1[10] = (float)((uint)bVar11 * auVar32._40_4_ | (uint)!bVar11 * (int)pfVar1[10]);
          pfVar1[0xb] = (float)((uint)bVar12 * auVar32._44_4_ | (uint)!bVar12 * (int)pfVar1[0xb]);
          pfVar1[0xc] = (float)((uint)bVar13 * auVar32._48_4_ | (uint)!bVar13 * (int)pfVar1[0xc]);
          pfVar1[0xd] = (float)((uint)bVar14 * auVar32._52_4_ | (uint)!bVar14 * (int)pfVar1[0xd]);
          pfVar1[0xe] = (float)((uint)bVar15 * auVar32._56_4_ | (uint)!bVar15 * (int)pfVar1[0xe]);
          pfVar1[0xf] = (float)((uint)(bVar18 >> 7) * auVar32._60_4_ |
                               (uint)!(bool)(bVar18 >> 7) * (int)pfVar1[0xf]);
          lVar23 = lVar23 + 0x10;
        } while (((func_00.n + 0x3fffffffffffffff & 0x3fffffffffffffff) + 0x10) -
                 (ulong)((uint)(func_00.n + 0x3fffffffffffffff) & 0xf) != lVar23);
      }
      func_00.ptr = d.values;
      PiecewiseConstant2D::PiecewiseConstant2D
                ((PiecewiseConstant2D *)&vb,func_00,auVar35._0_4_,auVar35._4_4_,
                 (Bounds2f)(ZEXT816(0x3f8000003f800000) << 0x40),alloc);
      (this->compensatedDistribution).domain.pMin.super_Tuple2<pbrt::Point2,_float> =
           (Tuple2<pbrt::Point2,_float>)vb;
      (this->compensatedDistribution).domain.pMax.super_Tuple2<pbrt::Point2,_float> = TStack_d8;
      pstd::
      vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>
      ::operator=(&(this->compensatedDistribution).pConditionalV,
                  (vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>
                   *)local_d0);
      pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
                (&(this->compensatedDistribution).pMarginal.func,
                 (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)local_b0);
      pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
                (&(this->compensatedDistribution).pMarginal.cdf,&local_90);
      (this->compensatedDistribution).pMarginal.funcInt = local_68;
      (this->compensatedDistribution).pMarginal.min = local_70;
      (this->compensatedDistribution).pMarginal.max = FStack_6c;
      pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&local_90);
      pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
                ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)local_b0);
      pstd::
      vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>
      ::~vector((vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>
                 *)local_d0);
      Array2D<float>::~Array2D(&d);
      InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector
                (&channelDesc.offset);
      return;
    }
  }
  LogFatal<char_const(&)[25]>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/lights.cpp"
             ,0x3ad,"Check failed: %s",(char (*) [25])"channelDesc.IsIdentity()");
}

Assistant:

ImageInfiniteLight::ImageInfiniteLight(Transform renderFromLight, Image im,
                                       const RGBColorSpace *imageColorSpace, Float scale,
                                       std::string filename, Allocator alloc)
    : LightBase(LightType::Infinite, renderFromLight, MediumInterface()),
      image(std::move(im)),
      imageColorSpace(imageColorSpace),
      scale(scale),
      distribution(alloc),
      compensatedDistribution(alloc) {
    // Initialize sampling PDFs for image infinite area light
    ImageChannelDesc channelDesc = image.GetChannelDesc({"R", "G", "B"});
    if (!channelDesc)
        ErrorExit("%s: image used for ImageInfiniteLight doesn't have R, G, B "
                  "channels.",
                  filename);
    CHECK_EQ(3, channelDesc.size());
    CHECK(channelDesc.IsIdentity());
    if (image.Resolution().x != image.Resolution().y)
        ErrorExit("%s: image resolution (%d, %d) is non-square. It's unlikely "
                  "this is an equal area environment map.",
                  filename, image.Resolution().x, image.Resolution().y);
    Array2D<Float> d = image.GetSamplingDistribution();
    Bounds2f domain = Bounds2f(Point2f(0, 0), Point2f(1, 1));
    distribution = PiecewiseConstant2D(d, domain, alloc);

    // Initialize compensated PDF for image infinite area light
    Float average = std::accumulate(d.begin(), d.end(), 0.) / d.size();
    for (Float &v : d)
        v = std::max<Float>(v - average, std::min<Float>(.001f * average, v));
    compensatedDistribution = PiecewiseConstant2D(d, domain, alloc);
}